

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O2

void __thiscall
duckdb::LimitLocalState::LimitLocalState
          (LimitLocalState *this,ClientContext *context,PhysicalLimit *op)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  (this->super_LocalSinkState).partition_info.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  this->current_offset = 0;
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LimitLocalState_027c1cf8;
  *(undefined4 *)&(this->limit).index = 0xffffffff;
  *(undefined4 *)((long)&(this->limit).index + 4) = 0xffffffff;
  *(undefined4 *)&(this->offset).index = 0xffffffff;
  *(undefined4 *)((long)&(this->offset).index + 4) = 0xffffffff;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,
             &(op->super_PhysicalOperator).types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  BatchedDataCollection::BatchedDataCollection
            (&this->data,context,(vector<duckdb::LogicalType,_true> *)&local_40,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  PhysicalLimit::SetInitialLimits(&op->limit_val,&op->offset_val,&this->limit,&this->offset);
  return;
}

Assistant:

explicit LimitLocalState(ClientContext &context, const PhysicalLimit &op)
	    : current_offset(0), data(context, op.types, true) {
		PhysicalLimit::SetInitialLimits(op.limit_val, op.offset_val, limit, offset);
	}